

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::InsertInclude(cmTarget *this,cmValueWithOrigin *entry,bool before)

{
  cmTargetInternals *pcVar1;
  const_iterator __position;
  cmGeneratorExpression cVar2;
  cmCompiledGeneratorExpression *x;
  undefined8 *puVar3;
  cmGeneratorExpression local_48;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_38;
  value_type local_30;
  
  cmGeneratorExpression::cmGeneratorExpression(&ge,&entry->Backtrace);
  pcVar1 = (this->Internal).Pointer;
  __position._M_current =
       (&(pcVar1->IncludeDirectoriesEntries).
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_start)[!before];
  puVar3 = (undefined8 *)operator_new(0x10);
  cmGeneratorExpression::Parse(&local_48,(string *)&ge);
  cVar2.Backtrace = local_48.Backtrace;
  local_48.Backtrace = (cmListFileBacktrace *)0x0;
  local_38.x_ = (cmCompiledGeneratorExpression *)0x0;
  *puVar3 = cVar2.Backtrace;
  puVar3[1] = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
  local_30 = (value_type)puVar3;
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::_M_insert_rval(&pcVar1->IncludeDirectoriesEntries,__position,&local_30);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_38);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_48);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTarget::InsertInclude(const cmValueWithOrigin &entry,
                     bool before)
{
  cmGeneratorExpression ge(&entry.Backtrace);

  std::vector<cmTargetInternals::TargetPropertyEntry*>::iterator position
                = before ? this->Internal->IncludeDirectoriesEntries.begin()
                         : this->Internal->IncludeDirectoriesEntries.end();

  this->Internal->IncludeDirectoriesEntries.insert(position,
      new cmTargetInternals::TargetPropertyEntry(ge.Parse(entry.Value)));
}